

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.cc
# Opt level: O3

bool __thiscall libwebm::VpxPes2Ts::ConvertToFile(VpxPes2Ts *this)

{
  FILE *__stream;
  bool bVar1;
  FILE *pFVar2;
  Webm2Pes *pWVar3;
  
  pFVar2 = fopen((this->output_file_name_)._M_dataplus._M_p,"wb");
  __stream = (FILE *)(this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>
                     ._M_t.super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  (this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)pFVar2;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    pFVar2 = (FILE *)(this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>
                     ._M_t.super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  }
  if (pFVar2 == (FILE *)0x0) {
    ConvertToFile((VpxPes2Ts *)&this->output_file_name_);
  }
  else {
    pWVar3 = (Webm2Pes *)operator_new(0xa8);
    Webm2Pes::Webm2Pes(pWVar3,&this->input_file_name_,&this->super_PacketReceiverInterface);
    std::__uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>::reset
              ((__uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_> *)
               &this->pes_converter_,pWVar3);
    pWVar3 = (this->pes_converter_)._M_t.
             super___uniq_ptr_impl<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>._M_t.
             super__Tuple_impl<0UL,_libwebm::Webm2Pes_*,_std::default_delete<libwebm::Webm2Pes>_>.
             super__Head_base<0UL,_libwebm::Webm2Pes_*,_false>._M_head_impl;
    if (pWVar3 != (Webm2Pes *)0x0) {
      bVar1 = Webm2Pes::ConvertToPacketReceiver(pWVar3);
      return bVar1;
    }
    ConvertToFile();
  }
  return false;
}

Assistant:

bool VpxPes2Ts::ConvertToFile() {
  output_file_ = FilePtr(fopen(output_file_name_.c_str(), "wb"), FILEDeleter());
  if (output_file_ == nullptr) {
    std::fprintf(stderr, "VpxPes2Ts: Cannot open %s for output.\n",
                 output_file_name_.c_str());
    return false;
  }
  pes_converter_.reset(new Webm2Pes(input_file_name_, this));
  if (pes_converter_ == nullptr) {
    std::fprintf(stderr, "VpxPes2Ts: Out of memory.\n");
    return false;
  }
  return pes_converter_->ConvertToPacketReceiver();
}